

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool openssh_loadpub(BinarySource *src,char **algorithm,BinarySink *bs,char **commentptr,
                     char **errorstr)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *__s;
  char *pcVar5;
  size_t sVar6;
  void *pvVar7;
  ptrlen pl;
  int alglen;
  int pubblobsize;
  int pubbloblen;
  uchar *pubblob;
  char *comment;
  char *base64;
  char *line;
  char *error;
  char **errorstr_local;
  char **commentptr_local;
  BinarySink *bs_local;
  char **algorithm_local;
  BinarySource *src_local;
  
  pubblob = (uchar *)0x0;
  _pubblobsize = (void *)0x0;
  pl = BinarySource_get_chomped_line(src->binarysource_);
  __s = mkstr(pl);
  pcVar5 = strchr(__s,0x20);
  if (pcVar5 == (char *)0x0) {
    line = "no key blob in OpenSSH public key file";
  }
  else {
    comment = pcVar5 + 1;
    *pcVar5 = '\0';
    pubblob = (uchar *)strchr(comment,0x20);
    if (pubblob != (uchar *)0x0) {
      *pubblob = '\0';
      pubblob = (uchar *)dupstr((char *)(pubblob + 1));
    }
    sVar6 = strlen(comment);
    iVar1 = (int)(sVar6 >> 2) * 3;
    _pubblobsize = safemalloc((long)iVar1,1,0);
    alglen = 0;
    while (pvVar7 = memchr(comment,0,4), pvVar7 == (void *)0x0) {
      if (iVar1 < alglen + 3) {
        __assert_fail("pubbloblen + 3 <= pubblobsize",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                      0x4a0,
                      "_Bool openssh_loadpub(BinarySource *, char **, BinarySink *, char **, const char **)"
                     );
      }
      iVar2 = base64_decode_atom(comment,(uchar *)((long)_pubblobsize + (long)alglen));
      alglen = iVar2 + alglen;
      comment = comment + 4;
    }
    if (*comment == '\0') {
      sVar6 = strlen(__s);
      uVar3 = (uint32_t)sVar6;
      if ((((int)(uVar3 + 4) <= alglen) &&
          (uVar4 = GET_32BIT_MSB_FIRST(_pubblobsize), uVar4 == uVar3)) &&
         (iVar1 = memcmp((void *)((long)_pubblobsize + 4),__s,(long)(int)uVar3), iVar1 == 0)) {
        if (algorithm != (char **)0x0) {
          pcVar5 = dupstr(__s);
          *algorithm = pcVar5;
        }
        if (commentptr == (char **)0x0) {
          safefree(pubblob);
        }
        else {
          *commentptr = (char *)pubblob;
        }
        safefree(__s);
        BinarySink_put_data(bs->binarysink_,_pubblobsize,(long)alglen);
        safefree(_pubblobsize);
        return true;
      }
      line = "key algorithms do not match in OpenSSH public key file";
    }
    else {
      line = "invalid length for base64 data in OpenSSH public key file";
    }
  }
  safefree(__s);
  safefree(pubblob);
  safefree(_pubblobsize);
  if (errorstr != (char **)0x0) {
    *errorstr = line;
  }
  return false;
}

Assistant:

static bool openssh_loadpub(BinarySource *src, char **algorithm,
                            BinarySink *bs,
                            char **commentptr, const char **errorstr)
{
    const char *error;
    char *line, *base64;
    char *comment = NULL;
    unsigned char *pubblob = NULL;
    int pubbloblen, pubblobsize;
    int alglen;

    line = mkstr(get_chomped_line(src));

    base64 = strchr(line, ' ');
    if (!base64) {
        error = "no key blob in OpenSSH public key file";
        goto error;
    }
    *base64++ = '\0';

    comment = strchr(base64, ' ');
    if (comment) {
        *comment++ = '\0';
        comment = dupstr(comment);
    }

    pubblobsize = strlen(base64) / 4 * 3;
    pubblob = snewn(pubblobsize, unsigned char);
    pubbloblen = 0;

    while (!memchr(base64, '\0', 4)) {
        assert(pubbloblen + 3 <= pubblobsize);
        pubbloblen += base64_decode_atom(base64, pubblob + pubbloblen);
        base64 += 4;
    }
    if (*base64) {
        error = "invalid length for base64 data in OpenSSH public key file";
        goto error;
    }

    /*
     * Sanity check: the first word on the line should be the key
     * algorithm, and should match the encoded string at the start of
     * the public blob.
     */
    alglen = strlen(line);
    if (pubbloblen < alglen + 4 ||
        GET_32BIT_MSB_FIRST(pubblob) != alglen ||
        0 != memcmp(pubblob + 4, line, alglen)) {
        error = "key algorithms do not match in OpenSSH public key file";
        goto error;
    }

    /*
     * Done.
     */
    if (algorithm)
        *algorithm = dupstr(line);
    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);
    sfree(line);
    put_data(bs, pubblob, pubbloblen);
    sfree(pubblob);
    return true;

  error:
    sfree(line);
    sfree(comment);
    sfree(pubblob);
    if (errorstr)
        *errorstr = error;
    return false;
}